

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_lax_indexed_indirect_Test::~CpuTest_lax_indexed_indirect_Test
          (CpuTest_lax_indexed_indirect_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, lax_indexed_indirect) {
    registers.pc = expected.pc = 0x4322;
    registers.x = 0xED;
    expected.x = 0x42; // X is overwritten, so we can not use the test fixture
    expected.a = 0x42;
    stage_instruction(LAX_INXIND);
    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0xAB));
    EXPECT_CALL(mmu, read_byte(0xAB)).WillOnce(Return(0x68)); // Dummy read
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED))).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0xAB + 0xED + 1u)))
            .WillOnce(Return(0x12));
    EXPECT_CALL(mmu, read_byte(0x1234)).WillOnce(Return(0x42));

    step_execution(6);
    EXPECT_EQ(expected, registers);
}